

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codearith(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2,int line)

{
  int iVar1;
  int local_38;
  int o1;
  int o2;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  OpCode op_local;
  FuncState *fs_local;
  
  iVar1 = constfolding(op,e1,e2);
  if (iVar1 == 0) {
    if ((op == OP_UNM) || (op == OP_LEN)) {
      local_38 = 0;
    }
    else {
      local_38 = luaK_exp2RK(fs,e2);
    }
    iVar1 = luaK_exp2RK(fs,e1);
    if (local_38 < iVar1) {
      freeexp(fs,e1);
      freeexp(fs,e2);
    }
    else {
      freeexp(fs,e2);
      freeexp(fs,e1);
    }
    iVar1 = luaK_codeABC(fs,op,0,iVar1,local_38);
    (e1->u).info = iVar1;
    e1->k = VRELOCABLE;
    luaK_fixline(fs,line);
  }
  return;
}

Assistant:

static void codearith (FuncState *fs, OpCode op,
                       expdesc *e1, expdesc *e2, int line) {
  if (constfolding(op, e1, e2))
    return;
  else {
    int o2 = (op != OP_UNM && op != OP_LEN) ? luaK_exp2RK(fs, e2) : 0;
    int o1 = luaK_exp2RK(fs, e1);
    if (o1 > o2) {
      freeexp(fs, e1);
      freeexp(fs, e2);
    }
    else {
      freeexp(fs, e2);
      freeexp(fs, e1);
    }
    e1->u.info = luaK_codeABC(fs, op, 0, o1, o2);
    e1->k = VRELOCABLE;
    luaK_fixline(fs, line);
  }
}